

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O0

int __kmp_dispatch_next<int>
              (ident_t *loc,int gtid,kmp_int32 *p_last,int *p_lb,int *p_ub,signed_t *p_st,
              void *codeptr)

{
  int iVar1;
  int iVar2;
  kmp_info_t *pkVar3;
  dispatch_private_info_t *pdVar4;
  dispatch_shared_info_t *pdVar5;
  cons_type cVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  kmp_int32 kVar10;
  ompt_data_t *poVar11;
  ompt_task_info_t *poVar12;
  kmp_int32 *in_RCX;
  uint *in_RDX;
  int in_ESI;
  kmp_int32 *in_R8;
  int *in_R9;
  void *in_stack_00000008;
  ompt_task_info_t *task_info_1;
  ompt_team_info_t *team_info_1;
  kmp_lock_t *lck;
  kmp_info_t **other_threads;
  int i;
  UT num_done;
  dispatch_shared_info_template<int> *sh;
  kmp_int32 last_1;
  ompt_task_info_t *task_info;
  ompt_team_info_t *team_info;
  int chunk;
  ST incr;
  UT init;
  UT trip;
  UT limit;
  int start;
  kmp_int32 last;
  kmp_team_t *team;
  kmp_info_t *th;
  dispatch_private_info_template<int> *pr;
  dispatch_shared_info_template<int> *in_stack_000000a0;
  int status;
  int in_stack_000000c8;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 uVar13;
  undefined4 in_stack_ffffffffffffff2c;
  cons_type in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff38;
  int depth;
  undefined8 in_stack_ffffffffffffff40;
  int depth_00;
  kmp_uint32 local_6c;
  uint local_44;
  uint local_c;
  
  depth_00 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  depth = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  pkVar3 = __kmp_threads[in_ESI];
  if ((((pkVar3->th).th_team)->t).t_serialized == 0) {
    pdVar4 = ((pkVar3->th).th_dispatch)->th_dispatch_pr_current;
    pdVar5 = ((pkVar3->th).th_dispatch)->th_dispatch_sh_current;
    uVar13 = *(undefined4 *)(pkVar3->th_pad + 0x20);
    local_c = __kmp_dispatch_next_algorithm<int>
                        ((int)p_ub,(dispatch_private_info_template<int> *)p_st,in_stack_000000a0,
                         (kmp_int32 *)pr,(int *)th->th_pad,(int *)team->t_pad,p_last,
                         in_stack_000000c8,(int)loc);
    if (local_c == 0) {
      kVar10 = test_then_inc<int>((kmp_int32 *)&(pdVar5->u).s32.num_done);
      if (kVar10 == (pkVar3->th).th_team_nproc + -1) {
        (pdVar5->u).s32.num_done = 0;
        (pdVar5->u).s32.iteration = 0;
        if (((uint)pdVar4->flags & 1) != 0) {
          (pdVar5->u).s32.ordered_iteration = 0;
        }
        pdVar5->buffer_index = pdVar5->buffer_index + __kmp_dispatch_num_buffers;
      }
      if ((__kmp_env_consistency_check != 0) && (pdVar4->pushed_ws != ct_none)) {
        cVar6 = __kmp_pop_workshare(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                                    (ident_t *)CONCAT44(in_stack_ffffffffffffff2c,uVar13));
        pdVar4->pushed_ws = cVar6;
      }
      ((pkVar3->th).th_dispatch)->th_deo_fcn = (_func_void_int_ptr_int_ptr_ident_t_ptr *)0x0;
      ((pkVar3->th).th_dispatch)->th_dxo_fcn = (_func_void_int_ptr_int_ptr_ident_t_ptr *)0x0;
      ((pkVar3->th).th_dispatch)->th_dispatch_sh_current = (dispatch_shared_info_t *)0x0;
      ((pkVar3->th).th_dispatch)->th_dispatch_pr_current = (dispatch_private_info_t *)0x0;
    }
    if ((in_RDX != (uint *)0x0) && (local_c != 0)) {
      *in_RDX = 0;
    }
    if ((local_c == 0) && (((ulong)ompt_enabled >> 0x14 & 1) != 0)) {
      poVar11 = &__ompt_get_teaminfo(depth,(int *)CONCAT44(in_stack_ffffffffffffff34,
                                                           in_stack_ffffffffffffff30))->
                 parallel_data;
      poVar12 = __ompt_get_task_info_object((int)((ulong)poVar11 >> 0x20));
      (*ompt_callbacks.ompt_callback_work_callback)
                (ompt_work_loop,ompt_scope_end,poVar11,&poVar12->task_data,0,in_stack_00000008);
    }
  }
  else {
    pdVar4 = ((pkVar3->th).th_dispatch)->th_disp_buffer;
    local_44 = (uint)((pdVar4->u).p32.tc != 0);
    if (local_44 == 0) {
      *in_RCX = 0;
      *in_R8 = 0;
      if (in_R9 != (int *)0x0) {
        *in_R9 = 0;
      }
      if ((__kmp_env_consistency_check != 0) && (pdVar4->pushed_ws != ct_none)) {
        cVar6 = __kmp_pop_workshare(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                                    (ident_t *)
                                    CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        pdVar4->pushed_ws = cVar6;
      }
    }
    else if (((uint)pdVar4->flags >> 1 & 1) == 0) {
      (pdVar4->u).p32.tc = 0;
      *in_RCX = (pdVar4->u).p32.lb;
      *in_R8 = (pdVar4->u).p32.ub;
      if (in_RDX != (uint *)0x0) {
        *in_RDX = 1;
      }
      if (in_R9 != (int *)0x0) {
        *in_R9 = (pdVar4->u).p32.st;
      }
    }
    else {
      iVar1 = (pdVar4->u).p32.field_6.parm1;
      iVar2 = (pdVar4->u).p32.count;
      (pdVar4->u).p32.count = iVar2 + 1;
      uVar7 = iVar1 * iVar2;
      uVar8 = (pdVar4->u).p32.tc - 1;
      local_44 = (uint)(uVar7 <= uVar8);
      if (local_44 == 0) {
        *in_RCX = 0;
        *in_R8 = 0;
        if (in_R9 != (int *)0x0) {
          *in_R9 = 0;
        }
        if ((__kmp_env_consistency_check != 0) && (pdVar4->pushed_ws != ct_none)) {
          cVar6 = __kmp_pop_workshare(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                                      (ident_t *)
                                      CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
          ;
          pdVar4->pushed_ws = cVar6;
        }
      }
      else {
        iVar2 = (pdVar4->u).p32.lb;
        local_6c = (iVar1 + uVar7) - 1;
        iVar1 = (pdVar4->u).p32.st;
        uVar9 = (uint)(uVar8 <= local_6c);
        if (uVar9 != 0) {
          local_6c = uVar8;
        }
        if (in_RDX != (uint *)0x0) {
          *in_RDX = uVar9;
        }
        if (in_R9 != (int *)0x0) {
          *in_R9 = iVar1;
        }
        if (iVar1 == 1) {
          *in_RCX = iVar2 + uVar7;
          *in_R8 = iVar2 + local_6c;
        }
        else {
          *in_RCX = iVar2 + uVar7 * iVar1;
          *in_R8 = iVar2 + local_6c * iVar1;
        }
        if (((uint)pdVar4->flags & 1) != 0) {
          (pdVar4->u).p32.ordered_lower = uVar7;
          (pdVar4->u).p32.ordered_upper = local_6c;
        }
      }
    }
    if ((local_44 == 0) && (((ulong)ompt_enabled >> 0x14 & 1) != 0)) {
      poVar11 = &__ompt_get_teaminfo(depth,(int *)CONCAT44(in_stack_ffffffffffffff34,
                                                           in_stack_ffffffffffffff30))->
                 parallel_data;
      poVar12 = __ompt_get_task_info_object(depth_00);
      (*ompt_callbacks.ompt_callback_work_callback)
                (ompt_work_loop,ompt_scope_end,poVar11,&poVar12->task_data,0,in_stack_00000008);
    }
    local_c = local_44;
  }
  return local_c;
}

Assistant:

static int __kmp_dispatch_next(ident_t *loc, int gtid, kmp_int32 *p_last,
                               T *p_lb, T *p_ub,
                               typename traits_t<T>::signed_t *p_st
#if OMPT_SUPPORT && OMPT_OPTIONAL
                               ,
                               void *codeptr
#endif
                               ) {

  typedef typename traits_t<T>::unsigned_t UT;
  typedef typename traits_t<T>::signed_t ST;
  // This is potentially slightly misleading, schedule(runtime) will appear here
  // even if the actual runtme schedule is static. (Which points out a
  // disadavantage of schedule(runtime): even when static scheduling is used it
  // costs more than a compile time choice to use static scheduling would.)
  KMP_TIME_PARTITIONED_BLOCK(OMP_loop_dynamic_scheduling);

  int status;
  dispatch_private_info_template<T> *pr;
  kmp_info_t *th = __kmp_threads[gtid];
  kmp_team_t *team = th->th.th_team;

  KMP_DEBUG_ASSERT(p_lb && p_ub && p_st); // AC: these cannot be NULL
  KD_TRACE(
      1000,
      ("__kmp_dispatch_next: T#%d called p_lb:%p p_ub:%p p_st:%p p_last: %p\n",
       gtid, p_lb, p_ub, p_st, p_last));

  if (team->t.t_serialized) {
    /* NOTE: serialize this dispatch becase we are not at the active level */
    pr = reinterpret_cast<dispatch_private_info_template<T> *>(
        th->th.th_dispatch->th_disp_buffer); /* top of the stack */
    KMP_DEBUG_ASSERT(pr);

    if ((status = (pr->u.p.tc != 0)) == 0) {
      *p_lb = 0;
      *p_ub = 0;
      //            if ( p_last != NULL )
      //                *p_last = 0;
      if (p_st != NULL)
        *p_st = 0;
      if (__kmp_env_consistency_check) {
        if (pr->pushed_ws != ct_none) {
          pr->pushed_ws = __kmp_pop_workshare(gtid, pr->pushed_ws, loc);
        }
      }
    } else if (pr->flags.nomerge) {
      kmp_int32 last;
      T start;
      UT limit, trip, init;
      ST incr;
      T chunk = pr->u.p.parm1;

      KD_TRACE(100, ("__kmp_dispatch_next: T#%d kmp_sch_dynamic_chunked case\n",
                     gtid));

      init = chunk * pr->u.p.count++;
      trip = pr->u.p.tc - 1;

      if ((status = (init <= trip)) == 0) {
        *p_lb = 0;
        *p_ub = 0;
        //                if ( p_last != NULL )
        //                    *p_last = 0;
        if (p_st != NULL)
          *p_st = 0;
        if (__kmp_env_consistency_check) {
          if (pr->pushed_ws != ct_none) {
            pr->pushed_ws = __kmp_pop_workshare(gtid, pr->pushed_ws, loc);
          }
        }
      } else {
        start = pr->u.p.lb;
        limit = chunk + init - 1;
        incr = pr->u.p.st;

        if ((last = (limit >= trip)) != 0) {
          limit = trip;
#if KMP_OS_WINDOWS
          pr->u.p.last_upper = pr->u.p.ub;
#endif /* KMP_OS_WINDOWS */
        }
        if (p_last != NULL)
          *p_last = last;
        if (p_st != NULL)
          *p_st = incr;
        if (incr == 1) {
          *p_lb = start + init;
          *p_ub = start + limit;
        } else {
          *p_lb = start + init * incr;
          *p_ub = start + limit * incr;
        }

        if (pr->flags.ordered) {
          pr->u.p.ordered_lower = init;
          pr->u.p.ordered_upper = limit;
#ifdef KMP_DEBUG
          {
            char *buff;
            // create format specifiers before the debug output
            buff = __kmp_str_format("__kmp_dispatch_next: T#%%d "
                                    "ordered_lower:%%%s ordered_upper:%%%s\n",
                                    traits_t<UT>::spec, traits_t<UT>::spec);
            KD_TRACE(1000, (buff, gtid, pr->u.p.ordered_lower,
                            pr->u.p.ordered_upper));
            __kmp_str_free(&buff);
          }
#endif
        } // if
      } // if
    } else {
      pr->u.p.tc = 0;
      *p_lb = pr->u.p.lb;
      *p_ub = pr->u.p.ub;
#if KMP_OS_WINDOWS
      pr->u.p.last_upper = *p_ub;
#endif /* KMP_OS_WINDOWS */
      if (p_last != NULL)
        *p_last = TRUE;
      if (p_st != NULL)
        *p_st = pr->u.p.st;
    } // if
#ifdef KMP_DEBUG
    {
      char *buff;
      // create format specifiers before the debug output
      buff = __kmp_str_format(
          "__kmp_dispatch_next: T#%%d serialized case: p_lb:%%%s "
          "p_ub:%%%s p_st:%%%s p_last:%%p %%d  returning:%%d\n",
          traits_t<T>::spec, traits_t<T>::spec, traits_t<ST>::spec);
      KD_TRACE(10, (buff, gtid, *p_lb, *p_ub, *p_st, p_last, *p_last, status));
      __kmp_str_free(&buff);
    }
#endif
#if INCLUDE_SSC_MARKS
    SSC_MARK_DISPATCH_NEXT();
#endif
    OMPT_LOOP_END;
    KMP_STATS_LOOP_END;
    return status;
  } else {
    kmp_int32 last = 0;
    dispatch_shared_info_template<T> volatile *sh;

    KMP_DEBUG_ASSERT(th->th.th_dispatch ==
                     &th->th.th_team->t.t_dispatch[th->th.th_info.ds.ds_tid]);

    pr = reinterpret_cast<dispatch_private_info_template<T> *>(
        th->th.th_dispatch->th_dispatch_pr_current);
    KMP_DEBUG_ASSERT(pr);
    sh = reinterpret_cast<dispatch_shared_info_template<T> volatile *>(
        th->th.th_dispatch->th_dispatch_sh_current);
    KMP_DEBUG_ASSERT(sh);

#if KMP_USE_HIER_SCHED
    if (pr->flags.use_hier)
      status = sh->hier->next(loc, gtid, pr, &last, p_lb, p_ub, p_st);
    else
#endif // KMP_USE_HIER_SCHED
      status = __kmp_dispatch_next_algorithm<T>(gtid, pr, sh, &last, p_lb, p_ub,
                                                p_st, th->th.th_team_nproc,
                                                th->th.th_info.ds.ds_tid);
    // status == 0: no more iterations to execute
    if (status == 0) {
      UT num_done;

      num_done = test_then_inc<ST>((volatile ST *)&sh->u.s.num_done);
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_next: T#%%d increment num_done:%%%s\n",
            traits_t<UT>::spec);
        KD_TRACE(10, (buff, gtid, sh->u.s.num_done));
        __kmp_str_free(&buff);
      }
#endif

#if KMP_USE_HIER_SCHED
      pr->flags.use_hier = FALSE;
#endif
      if ((ST)num_done == th->th.th_team_nproc - 1) {
#if (KMP_STATIC_STEAL_ENABLED)
        if (pr->schedule == kmp_sch_static_steal &&
            traits_t<T>::type_size > 4) {
          int i;
          kmp_info_t **other_threads = team->t.t_threads;
          // loop complete, safe to destroy locks used for stealing
          for (i = 0; i < th->th.th_team_nproc; ++i) {
            kmp_lock_t *lck = other_threads[i]->th.th_dispatch->th_steal_lock;
            KMP_ASSERT(lck != NULL);
            __kmp_destroy_lock(lck);
            __kmp_free(lck);
            other_threads[i]->th.th_dispatch->th_steal_lock = NULL;
          }
        }
#endif
        /* NOTE: release this buffer to be reused */

        KMP_MB(); /* Flush all pending memory write invalidates.  */

        sh->u.s.num_done = 0;
        sh->u.s.iteration = 0;

        /* TODO replace with general release procedure? */
        if (pr->flags.ordered) {
          sh->u.s.ordered_iteration = 0;
        }

        KMP_MB(); /* Flush all pending memory write invalidates.  */

        sh->buffer_index += __kmp_dispatch_num_buffers;
        KD_TRACE(100, ("__kmp_dispatch_next: T#%d change buffer_index:%d\n",
                       gtid, sh->buffer_index));

        KMP_MB(); /* Flush all pending memory write invalidates.  */

      } // if
      if (__kmp_env_consistency_check) {
        if (pr->pushed_ws != ct_none) {
          pr->pushed_ws = __kmp_pop_workshare(gtid, pr->pushed_ws, loc);
        }
      }

      th->th.th_dispatch->th_deo_fcn = NULL;
      th->th.th_dispatch->th_dxo_fcn = NULL;
      th->th.th_dispatch->th_dispatch_sh_current = NULL;
      th->th.th_dispatch->th_dispatch_pr_current = NULL;
    } // if (status == 0)
#if KMP_OS_WINDOWS
    else if (last) {
      pr->u.p.last_upper = pr->u.p.ub;
    }
#endif /* KMP_OS_WINDOWS */
    if (p_last != NULL && status != 0)
      *p_last = last;
  } // if

#ifdef KMP_DEBUG
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format(
        "__kmp_dispatch_next: T#%%d normal case: "
        "p_lb:%%%s p_ub:%%%s p_st:%%%s p_last:%%p (%%d) returning:%%d\n",
        traits_t<T>::spec, traits_t<T>::spec, traits_t<ST>::spec);
    KD_TRACE(10, (buff, gtid, *p_lb, *p_ub, p_st ? *p_st : 0, p_last,
                  (p_last ? *p_last : 0), status));
    __kmp_str_free(&buff);
  }
#endif
#if INCLUDE_SSC_MARKS
  SSC_MARK_DISPATCH_NEXT();
#endif
  OMPT_LOOP_END;
  KMP_STATS_LOOP_END;
  return status;
}